

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyHttpImplPrivate::setCachingEnabled(QNetworkReplyHttpImplPrivate *this,bool enable)

{
  QAbstractNetworkCache *pQVar1;
  QDebug *pQVar2;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    if (this->cacheEnabled != false) {
      local_58 = 2;
      local_44 = 0;
      local_54 = 0;
      uStack_4c = 0;
      local_40 = "default";
      QMessageLogger::debug
                ((char *)&local_58,
                 "QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false)")
      ;
      pQVar1 = this->managerPrivate->networkCache;
      (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&(this->super_QNetworkReplyPrivate).url);
      this->cacheSaveDevice = (QIODevice *)0x0;
      this->cacheEnabled = false;
    }
  }
  else if (this->cacheEnabled == false) {
    if (this->bytesDownloaded == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        createCache(this);
        return;
      }
      goto LAB_00201b48;
    }
    local_44 = 0;
    local_54 = 0;
    uStack_4c = 0;
    local_40 = "default";
    local_58 = 2;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_38,"setCachingEnabled: ");
    pQVar2 = QDebug::operator<<(pQVar2,this->bytesDownloaded);
    QDebug::operator<<(pQVar2," bytesDownloaded");
    QDebug::~QDebug(&local_38);
    local_54 = 0;
    uStack_4c = 0;
    local_44 = 0;
    local_40 = "default";
    local_58 = 2;
    QMessageLogger::critical
              ((char *)&local_58,
               "QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written"
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00201b48:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::setCachingEnabled(bool enable)
{
    if (!enable && !cacheEnabled)
        return;                 // nothing to do
    if (enable && cacheEnabled)
        return;                 // nothing to do either!

    if (enable) {
        if (Q_UNLIKELY(bytesDownloaded)) {
            qDebug() << "setCachingEnabled: " << bytesDownloaded << " bytesDownloaded";
            // refuse to enable in this case
            qCritical("QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written");
            return;
        }

        createCache();
    } else {
        // someone told us to turn on, then back off?
        // ok... but you should make up your mind
        qDebug("QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false)");
        managerPrivate->networkCache->remove(url);
        cacheSaveDevice = nullptr;
        cacheEnabled = false;
    }
}